

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDefaultVertexAttributeTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::DefaultVertexAttributeTests::init
          (DefaultVertexAttributeTests *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  DataType dataType;
  undefined4 uVar2;
  TestContext *pTVar3;
  char *pcVar4;
  Context *pCVar5;
  _func_int **pp_Var6;
  TestNode *pTVar7;
  int extraout_EAX;
  long *plVar8;
  TestNode *pTVar9;
  undefined8 *puVar10;
  AttributeCase *pAVar11;
  FloatLoader *pFVar12;
  TestNode *pTVar13;
  long *plVar14;
  long lVar15;
  undefined4 *local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined2 uStack_72;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  TestNode *local_48;
  TestNode *local_40;
  long local_38;
  
  lVar15 = 0xc;
  local_48 = (TestNode *)this;
  do {
    local_40 = (TestNode *)operator_new(0x70);
    pTVar3 = ((TestNode *)this)->m_testCtx;
    pcVar4 = *(char **)((long)&PTR_iterate_00d0f3d0 + lVar15 + 4);
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"test with ","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_58 = *plVar14;
      lStack_50 = plVar8[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar14;
      local_68 = (long *)*plVar8;
    }
    local_60 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_40,pTVar3,pcVar4,(char *)local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    cVar1 = *(char *)((long)&init::floatTargets[0].name + lVar15);
    pCVar5 = (Context *)local_48[1]._vptr_TestNode;
    dataType = *(DataType *)(&UNK_00d0f3dc + lVar15);
    local_38 = lVar15;
    pTVar9 = (TestNode *)operator_new(0xb0);
    local_88 = &local_78;
    uStack_74 = 0x20;
    local_78 = 0x74736554;
    local_80 = 5;
    uStack_73 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_58 = *plVar14;
      lStack_50 = plVar8[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar14;
      local_68 = (long *)*plVar8;
    }
    local_60 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar9,pCVar5->m_testCtx,"vertex_attrib_1f",(char *)local_68);
    pTVar9[1]._vptr_TestNode = (_func_int **)pCVar5;
    pTVar9->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00d0f558;
    *(undefined2 *)&pTVar9[1].m_testCtx = 0x100;
    pTVar9[1].m_name._M_dataplus._M_p = "VertexAttrib1f";
    *(DataType *)&pTVar9[1].m_name._M_string_length = dataType;
    pTVar9[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar9[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar9[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar9[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar9[1].m_description._M_string_length = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    puVar10 = (undefined8 *)operator_new(8);
    pTVar13 = local_40;
    *puVar10 = &PTR__FloatLoader_00d0f5a8;
    *(undefined8 **)&pTVar9[1].m_name.field_2 = puVar10;
    tcu::TestNode::addChild(local_40,pTVar9);
    pTVar9 = local_48;
    pCVar5 = (Context *)local_48[1]._vptr_TestNode;
    if (cVar1 == '\0') {
      pTVar13 = (TestNode *)operator_new(0xb0);
      local_88 = &local_78;
      uStack_74 = 0x20;
      local_78 = 0x74736554;
      local_80 = 5;
      uStack_73 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
      pTVar9 = local_48;
      plVar14 = plVar8 + 2;
      if ((long *)*plVar8 == plVar14) {
        local_58 = *plVar14;
        lStack_50 = plVar8[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar14;
        local_68 = (long *)*plVar8;
      }
      local_60 = plVar8[1];
      *plVar8 = (long)plVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar13,pCVar5->m_testCtx,"vertex_attrib_2f",(char *)local_68);
      pTVar13[1]._vptr_TestNode = (_func_int **)pCVar5;
      pTVar13->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00d0f558;
      *(undefined2 *)&pTVar13[1].m_testCtx = 0x100;
      pTVar13[1].m_name._M_dataplus._M_p = "VertexAttrib2f";
      *(DataType *)&pTVar13[1].m_name._M_string_length = dataType;
      pTVar13[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar13[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar13[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar13[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar13[1].m_description._M_string_length = 0;
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78))
                                         ) + 1);
      }
      puVar10 = (undefined8 *)operator_new(8);
      *puVar10 = &PTR__FloatLoader_00d0f5f8;
      *(undefined8 **)&pTVar13[1].m_name.field_2 = puVar10;
      tcu::TestNode::addChild(local_40,pTVar13);
      pCVar5 = (Context *)pTVar9[1]._vptr_TestNode;
      pTVar9 = (TestNode *)operator_new(0xb0);
      local_88 = &local_78;
      uStack_74 = 0x20;
      local_78 = 0x74736554;
      local_80 = 5;
      uStack_73 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
      plVar14 = plVar8 + 2;
      if ((long *)*plVar8 == plVar14) {
        local_58 = *plVar14;
        lStack_50 = plVar8[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar14;
        local_68 = (long *)*plVar8;
      }
      local_60 = plVar8[1];
      *plVar8 = (long)plVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar9,pCVar5->m_testCtx,"vertex_attrib_3f",(char *)local_68);
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar5;
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00d0f558;
      *(undefined2 *)&pTVar9[1].m_testCtx = 0x100;
      pTVar9[1].m_name._M_dataplus._M_p = "VertexAttrib3f";
      *(DataType *)&pTVar9[1].m_name._M_string_length = dataType;
      pTVar9[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar9[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar9[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar9[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar9[1].m_description._M_string_length = 0;
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      pTVar13 = local_48;
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78))
                                         ) + 1);
      }
      puVar10 = (undefined8 *)operator_new(8);
      pTVar7 = local_40;
      *puVar10 = &PTR__FloatLoader_00d0f638;
      *(undefined8 **)&pTVar9[1].m_name.field_2 = puVar10;
      tcu::TestNode::addChild(local_40,pTVar9);
      pAVar11 = anon_unknown_1::AttributeCase::
                create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                          ((Context *)pTVar13[1]._vptr_TestNode,dataType);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pAVar11);
      pAVar11 = anon_unknown_1::AttributeCase::
                create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                          ((Context *)pTVar13[1]._vptr_TestNode,dataType);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pAVar11);
      pCVar5 = (Context *)pTVar13[1]._vptr_TestNode;
      pTVar9 = (TestNode *)operator_new(0xb0);
      local_88 = &local_78;
      uStack_74 = 0x20;
      local_78 = 0x74736554;
      local_80 = 5;
      uStack_73 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
      plVar14 = plVar8 + 2;
      if ((long *)*plVar8 == plVar14) {
        local_58 = *plVar14;
        lStack_50 = plVar8[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar14;
        local_68 = (long *)*plVar8;
      }
      local_60 = plVar8[1];
      *plVar8 = (long)plVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar9,pCVar5->m_testCtx,"vertex_attrib_2fv",(char *)local_68);
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar5;
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00d0f558;
      *(undefined2 *)&pTVar9[1].m_testCtx = 0x100;
      pTVar9[1].m_name._M_dataplus._M_p = "VertexAttrib2fv";
      *(DataType *)&pTVar9[1].m_name._M_string_length = dataType;
      pTVar9[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar9[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar9[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar9[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar9[1].m_description._M_string_length = 0;
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      pTVar13 = local_48;
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78))
                                         ) + 1);
      }
      puVar10 = (undefined8 *)operator_new(8);
      *puVar10 = &PTR__FloatLoader_00d0f6f8;
      *(undefined8 **)&pTVar9[1].m_name.field_2 = puVar10;
      tcu::TestNode::addChild(local_40,pTVar9);
      pCVar5 = (Context *)pTVar13[1]._vptr_TestNode;
      pAVar11 = (AttributeCase *)operator_new(0xb0);
      local_88 = &local_78;
      uStack_74 = 0x20;
      local_78 = 0x74736554;
      local_80 = 5;
      uStack_73 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
      plVar14 = plVar8 + 2;
      if ((long *)*plVar8 == plVar14) {
        local_58 = *plVar14;
        lStack_50 = plVar8[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar14;
        local_68 = (long *)*plVar8;
      }
      local_60 = plVar8[1];
      *plVar8 = (long)plVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pAVar11,pCVar5->m_testCtx,"vertex_attrib_3fv",(char *)local_68);
      (pAVar11->super_TestCase).m_context = pCVar5;
      (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__AttributeCase_00d0f558;
      pAVar11->m_normalizing = false;
      pAVar11->m_useNegativeValues = true;
      pAVar11->m_funcName = "VertexAttrib3fv";
      pAVar11->m_dataType = dataType;
      pAVar11->m_loader = (FloatLoader *)0x0;
      pAVar11->m_program = (ShaderProgram *)0x0;
      pAVar11->m_bufID = 0;
      pAVar11->m_allIterationsPassed = true;
      pAVar11->m_iteration = 0;
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78))
                                         ) + 1);
      }
      pFVar12 = (FloatLoader *)operator_new(8);
      pFVar12->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00d0f738;
      pAVar11->m_loader = pFVar12;
      pTVar13 = local_40;
      pTVar9 = local_48;
    }
    else {
      pAVar11 = anon_unknown_1::AttributeCase::
                create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                          (pCVar5,dataType);
      tcu::TestNode::addChild(pTVar13,(TestNode *)pAVar11);
      pAVar11 = anon_unknown_1::AttributeCase::
                create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                          ((Context *)pTVar9[1]._vptr_TestNode,dataType);
    }
    tcu::TestNode::addChild(pTVar13,(TestNode *)pAVar11);
    pCVar5 = (Context *)pTVar9[1]._vptr_TestNode;
    pTVar9 = (TestNode *)operator_new(0xb0);
    local_88 = &local_78;
    uStack_74 = 0x20;
    local_78 = 0x74736554;
    local_80 = 5;
    uStack_73 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_58 = *plVar14;
      lStack_50 = plVar8[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar14;
      local_68 = (long *)*plVar8;
    }
    local_60 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar9,pCVar5->m_testCtx,"vertex_attrib_4fv",(char *)local_68);
    pTVar9[1]._vptr_TestNode = (_func_int **)pCVar5;
    pTVar9->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00d0f558;
    *(undefined2 *)&pTVar9[1].m_testCtx = 0x100;
    pTVar9[1].m_name._M_dataplus._M_p = "VertexAttrib4fv";
    *(DataType *)&pTVar9[1].m_name._M_string_length = dataType;
    pTVar9[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar9[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar9[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar9[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar9[1].m_description._M_string_length = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    this = (DefaultVertexAttributeTests *)local_48;
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    puVar10 = (undefined8 *)operator_new(8);
    pTVar13 = local_40;
    *puVar10 = &PTR__FloatLoader_00d0f778;
    *(undefined8 **)&pTVar9[1].m_name.field_2 = puVar10;
    tcu::TestNode::addChild(local_40,pTVar9);
    tcu::TestNode::addChild((TestNode *)this,pTVar13);
    lVar15 = local_38 + 0x10;
  } while (lVar15 != 0xdc);
  lVar15 = 0;
  do {
    pTVar9 = (TestNode *)operator_new(0x70);
    pTVar3 = ((TestNode *)this)->m_testCtx;
    pcVar4 = *(char **)((long)&init::intTargets[0].name + lVar15);
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"test with ","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_68 = &local_58;
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_58 = *plVar14;
      lStack_50 = plVar8[3];
    }
    else {
      local_58 = *plVar14;
      local_68 = (long *)*plVar8;
    }
    local_60 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar9,pTVar3,pcVar4,(char *)local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    pp_Var6 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    uVar2 = *(undefined4 *)((long)&init::intTargets[0].dataType + lVar15);
    pTVar13 = (TestNode *)operator_new(0xb0);
    local_88 = &local_78;
    uStack_74 = 0x20;
    local_78 = 0x74736554;
    local_80 = 5;
    uStack_73 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_68 = &local_58;
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_58 = *plVar14;
      lStack_50 = plVar8[3];
    }
    else {
      local_58 = *plVar14;
      local_68 = (long *)*plVar8;
    }
    local_60 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,(TestContext *)*pp_Var6,"vertex_attribi_4i",(char *)local_68);
    pTVar13[1]._vptr_TestNode = pp_Var6;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00d0f558;
    *(undefined2 *)&pTVar13[1].m_testCtx = 0x100;
    pTVar13[1].m_name._M_dataplus._M_p = "VertexAttrib4i";
    *(undefined4 *)&pTVar13[1].m_name._M_string_length = uVar2;
    pTVar13[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar13[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar13[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar13[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar13[1].m_description._M_string_length = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    pTVar7 = local_48;
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    puVar10 = (undefined8 *)operator_new(8);
    *puVar10 = &PTR__FloatLoader_00d0f7b8;
    *(undefined8 **)&pTVar13[1].m_name.field_2 = puVar10;
    tcu::TestNode::addChild(pTVar9,pTVar13);
    pCVar5 = (Context *)pTVar7[1]._vptr_TestNode;
    pTVar13 = (TestNode *)operator_new(0xb0);
    local_88 = &local_78;
    uStack_74 = 0x20;
    local_78 = 0x74736554;
    local_80 = 5;
    uStack_73 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_68 = &local_58;
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_58 = *plVar14;
      lStack_50 = plVar8[3];
    }
    else {
      local_58 = *plVar14;
      local_68 = (long *)*plVar8;
    }
    local_60 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar5->m_testCtx,"vertex_attribi_4iv",(char *)local_68);
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar5;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00d0f558;
    *(undefined2 *)&pTVar13[1].m_testCtx = 0x100;
    pTVar13[1].m_name._M_dataplus._M_p = "VertexAttrib4iv";
    *(undefined4 *)&pTVar13[1].m_name._M_string_length = uVar2;
    pTVar13[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar13[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar13[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar13[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar13[1].m_description._M_string_length = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    this = (DefaultVertexAttributeTests *)local_48;
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    puVar10 = (undefined8 *)operator_new(8);
    *puVar10 = &PTR__FloatLoader_00d0f7f8;
    *(undefined8 **)&pTVar13[1].m_name.field_2 = puVar10;
    tcu::TestNode::addChild(pTVar9,pTVar13);
    tcu::TestNode::addChild((TestNode *)this,pTVar9);
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0x40);
  lVar15 = 0;
  do {
    pTVar9 = (TestNode *)operator_new(0x70);
    pTVar3 = ((TestNode *)this)->m_testCtx;
    pcVar4 = *(char **)((long)&init::uintTargets[0].name + lVar15);
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"test with ","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_68 = &local_58;
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_58 = *plVar14;
      lStack_50 = plVar8[3];
    }
    else {
      local_58 = *plVar14;
      local_68 = (long *)*plVar8;
    }
    local_60 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar9,pTVar3,pcVar4,(char *)local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    pp_Var6 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    uVar2 = *(undefined4 *)((long)&init::uintTargets[0].dataType + lVar15);
    pTVar13 = (TestNode *)operator_new(0xb0);
    local_88 = &local_78;
    uStack_74 = 0x20;
    local_78 = 0x74736554;
    local_80 = 5;
    uStack_73 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_68 = &local_58;
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_58 = *plVar14;
      lStack_50 = plVar8[3];
    }
    else {
      local_58 = *plVar14;
      local_68 = (long *)*plVar8;
    }
    local_60 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,(TestContext *)*pp_Var6,"vertex_attribi_4ui",(char *)local_68);
    pTVar13[1]._vptr_TestNode = pp_Var6;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00d0f558;
    *(undefined2 *)&pTVar13[1].m_testCtx = 0;
    pTVar13[1].m_name._M_dataplus._M_p = "VertexAttrib4ui";
    *(undefined4 *)&pTVar13[1].m_name._M_string_length = uVar2;
    pTVar13[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar13[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar13[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar13[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar13[1].m_description._M_string_length = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    pTVar7 = local_48;
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    puVar10 = (undefined8 *)operator_new(8);
    *puVar10 = &PTR__FloatLoader_00d0f838;
    *(undefined8 **)&pTVar13[1].m_name.field_2 = puVar10;
    tcu::TestNode::addChild(pTVar9,pTVar13);
    pCVar5 = (Context *)pTVar7[1]._vptr_TestNode;
    pTVar13 = (TestNode *)operator_new(0xb0);
    local_88 = &local_78;
    uStack_74 = 0x20;
    local_78 = 0x74736554;
    local_80 = 5;
    uStack_73 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_68 = &local_58;
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_58 = *plVar14;
      lStack_50 = plVar8[3];
    }
    else {
      local_58 = *plVar14;
      local_68 = (long *)*plVar8;
    }
    local_60 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar5->m_testCtx,"vertex_attribi_4uiv",(char *)local_68);
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar5;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00d0f558;
    *(undefined2 *)&pTVar13[1].m_testCtx = 0;
    pTVar13[1].m_name._M_dataplus._M_p = "VertexAttrib4uiv";
    *(undefined4 *)&pTVar13[1].m_name._M_string_length = uVar2;
    pTVar13[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar13[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar13[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar13[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar13[1].m_description._M_string_length = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    this = (DefaultVertexAttributeTests *)local_48;
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    puVar10 = (undefined8 *)operator_new(8);
    *puVar10 = &PTR__FloatLoader_00d0f878;
    *(undefined8 **)&pTVar13[1].m_name.field_2 = puVar10;
    tcu::TestNode::addChild(pTVar9,pTVar13);
    tcu::TestNode::addChild((TestNode *)this,pTVar9);
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0x40);
  return extraout_EAX;
}

Assistant:

void DefaultVertexAttributeTests::init (void)
{
	struct Target
	{
		const char*		name;
		glu::DataType	dataType;
		bool			reducedTestSets;	// !< use reduced coverage
	};

	static const Target floatTargets[] =
	{
		{ "float",	glu::TYPE_FLOAT,		false	},
		{ "vec2",	glu::TYPE_FLOAT_VEC2,	true	},
		{ "vec3",	glu::TYPE_FLOAT_VEC3,	true	},
		{ "vec4",	glu::TYPE_FLOAT_VEC4,	false	},
		{ "mat2",	glu::TYPE_FLOAT_MAT2,	true	},
		{ "mat2x3",	glu::TYPE_FLOAT_MAT2X3,	true	},
		{ "mat2x4",	glu::TYPE_FLOAT_MAT2X4,	true	},
		{ "mat3",	glu::TYPE_FLOAT_MAT3,	true	},
		{ "mat3x2",	glu::TYPE_FLOAT_MAT3X2,	true	},
		{ "mat3x4",	glu::TYPE_FLOAT_MAT3X4,	true	},
		{ "mat4",	glu::TYPE_FLOAT_MAT4,	false	},
		{ "mat4x2",	glu::TYPE_FLOAT_MAT4X2,	true	},
		{ "mat4x3",	glu::TYPE_FLOAT_MAT4X3,	true	},
	};

	static const Target intTargets[] =
	{
		{ "int",	glu::TYPE_INT,			false	},
		{ "ivec2",	glu::TYPE_INT_VEC2,		true	},
		{ "ivec3",	glu::TYPE_INT_VEC3,		true	},
		{ "ivec4",	glu::TYPE_INT_VEC4,		false	},
	};

	static const Target uintTargets[] =
	{
		{ "uint",	glu::TYPE_UINT,			false	},
		{ "uvec2",	glu::TYPE_UINT_VEC2,	true	},
		{ "uvec3",	glu::TYPE_UINT_VEC3,	true	},
		{ "uvec4",	glu::TYPE_UINT_VEC4,	false	},
	};

	// float targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(floatTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, floatTargets[targetNdx].name, (std::string("test with ") + floatTargets[targetNdx].name).c_str());
		const bool					fullSet	= !floatTargets[targetNdx].reducedTestSets;

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, floatTargets[targetNdx].dataType))
#define ADD_REDUCED_CASE(X)	if (fullSet) ADD_CASE(X)

		ADD_CASE		(LoaderVertexAttrib1f);
		ADD_REDUCED_CASE(LoaderVertexAttrib2f);
		ADD_REDUCED_CASE(LoaderVertexAttrib3f);
		ADD_CASE		(LoaderVertexAttrib4f);

		ADD_CASE		(LoaderVertexAttrib1fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib2fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib3fv);
		ADD_CASE		(LoaderVertexAttrib4fv);

#undef ADD_CASE
#undef ADD_REDUCED_CASE

		addChild(group);
	}

	// int targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(intTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, intTargets[targetNdx].name, (std::string("test with ") + intTargets[targetNdx].name).c_str());

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, intTargets[targetNdx].dataType))

		ADD_CASE		(LoaderVertexAttribI4i);
		ADD_CASE		(LoaderVertexAttribI4iv);

#undef ADD_CASE

		addChild(group);
	}

	// uint targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(uintTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, uintTargets[targetNdx].name, (std::string("test with ") + uintTargets[targetNdx].name).c_str());

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, uintTargets[targetNdx].dataType))

		ADD_CASE		(LoaderVertexAttribI4ui);
		ADD_CASE		(LoaderVertexAttribI4uiv);

#undef ADD_CASE

		addChild(group);
	}
}